

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void highbd_write_buffer_16xn_avx2
               (__m256i *in,uint16_t *output,int stride,int flipud,int height,int bd)

{
  __m256i res1;
  __m256i res0;
  __m256i pred;
  int iVar1;
  undefined8 *puVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  longlong in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  undefined8 uVar6;
  __m256i u;
  __m256i v;
  int i;
  int step;
  int j;
  int local_e4;
  undefined1 in_stack_ffffffffffffff60 [12];
  int iVar7;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  longlong in_stack_ffffffffffffffb0;
  
  if (in_ECX == 0) {
    local_e4 = 0;
  }
  else {
    local_e4 = in_R8D + -1;
  }
  iVar1 = 1;
  if (in_ECX != 0) {
    iVar1 = -1;
  }
  for (iVar7 = 0; iVar7 < in_R8D; iVar7 = iVar7 + 1) {
    puVar2 = (undefined8 *)(in_RSI + (long)(iVar7 * in_EDX) * 2);
    uVar3 = *puVar2;
    uVar4 = puVar2[1];
    lVar5 = puVar2[2];
    uVar6 = puVar2[3];
    pred[1] = in_stack_ffffffffffffffa0;
    pred[0] = (longlong)puVar2;
    pred[2] = in_stack_ffffffffffffffa8;
    pred[3] = in_stack_ffffffffffffffb0;
    res0[0]._4_4_ = in_R8D;
    res0[0]._0_4_ = in_R9D;
    res0[1]._0_4_ = in_ECX;
    res0[1]._4_4_ = in_EDX;
    res0[2] = in_RSI;
    res0[3] = in_RDI;
    res1._8_12_ = in_stack_ffffffffffffff60;
    res1[0] = uVar6;
    res1[2]._4_4_ = iVar7;
    res1[3]._0_4_ = iVar1;
    res1[3]._4_4_ = local_e4;
    highbd_get_recon_16x8_avx2(pred,res0,res1,(int)((ulong)lVar5 >> 0x20));
    puVar2 = (undefined8 *)(in_RSI + (long)(iVar7 * in_EDX) * 2);
    *puVar2 = uVar3;
    puVar2[1] = uVar4;
    puVar2[2] = lVar5;
    puVar2[3] = uVar6;
    local_e4 = iVar1 + local_e4;
    in_stack_ffffffffffffffa0 = uVar3;
    in_stack_ffffffffffffffa8 = uVar4;
    in_stack_ffffffffffffffb0 = lVar5;
  }
  return;
}

Assistant:

static inline void highbd_write_buffer_16xn_avx2(__m256i *in, uint16_t *output,
                                                 int stride, int flipud,
                                                 int height, const int bd) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    __m256i v = _mm256_loadu_si256((__m256i const *)(output + i * stride));
    __m256i u = highbd_get_recon_16x8_avx2(v, in[j], in[j + height], bd);

    _mm256_storeu_si256((__m256i *)(output + i * stride), u);
  }
}